

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O0

XML_Convert_Result ascii_toUtf8(ENCODING *enc,char **fromP,char *fromLim,char **toP,char *toLim)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  char *toLim_local;
  char **toP_local;
  char *fromLim_local;
  char **fromP_local;
  ENCODING *enc_local;
  
  while( true ) {
    bVar3 = false;
    if (*fromP < fromLim) {
      bVar3 = *toP < toLim;
    }
    if (!bVar3) break;
    pcVar2 = *fromP;
    *fromP = pcVar2 + 1;
    cVar1 = *pcVar2;
    pcVar2 = *toP;
    *toP = pcVar2 + 1;
    *pcVar2 = cVar1;
  }
  if ((*toP == toLim) && (*fromP < fromLim)) {
    enc_local._4_4_ = XML_CONVERT_OUTPUT_EXHAUSTED;
  }
  else {
    enc_local._4_4_ = XML_CONVERT_COMPLETED;
  }
  return enc_local._4_4_;
}

Assistant:

static enum XML_Convert_Result PTRCALL
ascii_toUtf8(const ENCODING *enc, const char **fromP, const char *fromLim,
             char **toP, const char *toLim) {
  UNUSED_P(enc);
  while (*fromP < fromLim && *toP < toLim)
    *(*toP)++ = *(*fromP)++;

  if ((*toP == toLim) && (*fromP < fromLim))
    return XML_CONVERT_OUTPUT_EXHAUSTED;
  else
    return XML_CONVERT_COMPLETED;
}